

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_unsigned.cpp
# Opt level: O1

bool sc_dt::operator<(sc_unsigned *u,long v)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  sc_digit vd [3];
  
  uVar3 = 0;
  if (-1 < v) {
    if (v == 0) {
      bVar6 = true;
    }
    else {
      uVar4 = 0;
      uVar5 = v;
      do {
        vd[uVar4] = (uint)uVar5 & 0x3fffffff;
        uVar3 = uVar4 + 1;
        bVar6 = uVar4 < 2;
        if (!bVar6) break;
        bVar1 = 0x3fffffff < uVar5;
        uVar4 = uVar3;
        uVar5 = uVar5 >> 0x1e;
      } while (bVar1);
    }
    if (bVar6) {
      memset(vd + (uVar3 & 0xffffffff),0,(ulong)(2 - (int)uVar3) * 4 + 4);
    }
    uVar2 = compare_unsigned(u->sgn,u->nbits,u->ndigits,u->digit,(uint)(v != 0),0x40,3,vd,0,0);
    uVar3 = (ulong)(uVar2 >> 0x1f);
  }
  return SUB81(uVar3,0);
}

Assistant:

bool
operator<(const sc_unsigned& u, long v)
{
  if (v < 0)
    return false;
  CONVERT_LONG(v);
  if (compare_unsigned(u.sgn, u.nbits, u.ndigits, u.digit,
                       vs, BITS_PER_ULONG, DIGITS_PER_ULONG, vd) < 0)
    return true;
  return false;
}